

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O0

void __thiscall
Camera::update_angle
          (Camera *this,float delta_time,double mouse_x,double mouse_y,int display_w,int display_h)

{
  double dVar1;
  double dVar2;
  double _y;
  double dVar3;
  double dVar4;
  undefined8 local_48;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_40;
  undefined8 local_3c;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_34;
  int local_30;
  int local_2c;
  int display_h_local;
  int display_w_local;
  double mouse_y_local;
  double mouse_x_local;
  Camera *pCStack_10;
  float delta_time_local;
  Camera *this_local;
  
  this->horizontal_angle =
       (float)((double)(this->mouse_speed * delta_time) * ((double)display_w / 2.0 - mouse_x) +
              (double)this->horizontal_angle);
  this->vertical_angle =
       (float)((double)(this->mouse_speed * delta_time) * ((double)display_h / 2.0 - mouse_y) +
              (double)this->vertical_angle);
  local_30 = display_h;
  local_2c = display_w;
  _display_h_local = mouse_y;
  mouse_y_local = mouse_x;
  mouse_x_local._4_4_ = delta_time;
  pCStack_10 = this;
  dVar1 = cos((double)this->vertical_angle);
  dVar2 = sin((double)this->horizontal_angle);
  _y = sin((double)this->vertical_angle);
  dVar3 = cos((double)this->vertical_angle);
  dVar4 = cos((double)this->horizontal_angle);
  glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
            ((vec<3,float,(glm::qualifier)0> *)&local_3c,dVar1 * dVar2,_y,dVar3 * dVar4);
  (this->direction).field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(undefined4)local_3c;
  (this->direction).field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_3c._4_4_;
  (this->direction).field_2 = local_34;
  dVar1 = sin((double)(this->horizontal_angle - 1.575795));
  dVar2 = cos((double)(this->horizontal_angle - 1.570795));
  glm::vec<3,float,(glm::qualifier)0>::vec<double,int,double>
            ((vec<3,float,(glm::qualifier)0> *)&local_48,dVar1,0,dVar2);
  (this->right).field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(undefined4)local_48;
  (this->right).field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_48._4_4_;
  (this->right).field_2 = local_40;
  return;
}

Assistant:

void Camera::update_angle(float delta_time, double mouse_x, double mouse_y, int display_w, int display_h) {
    horizontal_angle += mouse_speed * delta_time * (display_w/2.0 - mouse_x);
    vertical_angle   += mouse_speed * delta_time * (display_h/2.0 - mouse_y);
    
    direction = glm::vec3(
        cos(vertical_angle) * sin(horizontal_angle),
        sin(vertical_angle),
        cos(vertical_angle) * cos(horizontal_angle)
    );

    right = glm::vec3(
        sin(horizontal_angle - 3.15159f/2.0f),
        0,
        cos(horizontal_angle - 3.14159f/2.0f)
    );
}